

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense.hpp
# Opt level: O0

void __thiscall
remora::
dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>::
clear(dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
      *this)

{
  size_type sVar1;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *pmVar2;
  long *in_RDI;
  size_type j;
  size_type i;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffffd0;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_18;
  size_type local_10;
  
  local_10 = 0;
  while( true ) {
    sVar1 = major_size<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::cpu_tag>
                      (in_stack_ffffffffffffffd0);
    if (local_10 == sVar1) break;
    local_18 = (matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *)0x0;
    while( true ) {
      in_stack_ffffffffffffffd0 = local_18;
      pmVar2 = (matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *)minor_size<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::cpu_tag>
                            (local_18);
      if (in_stack_ffffffffffffffd0 == pmVar2) break;
      *(undefined8 *)(*in_RDI + (long)(local_18 + local_10 * in_RDI[3]) * 8) = 0;
      local_18 = local_18 + 1;
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void clear(){
		for(size_type i = 0; i != major_size(*this); ++i){
			for(size_type j = 0; j != minor_size(*this); ++j){
				m_values[i * m_leading_dimension + j] = value_type();
			}
		}
	}